

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::conditionalizeExpensiveOnBitwise
          (OptimizeInstructions *this,Binary *binary)

{
  PassRunner *pPVar1;
  Expression *curr;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  Const *pCVar5;
  If *pIVar6;
  uint uVar7;
  Expression *pEVar8;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  ulong in_R8;
  Expression *curr_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 local_328 [8];
  EffectAnalyzer leftEffects;
  EffectAnalyzer rightEffects;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Builder local_38;
  Builder builder;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  if (((pPVar1->options).optimizeLevel < 2) || (0 < (pPVar1->options).shrinkLevel)) {
    return (Expression *)(If *)0x0;
  }
  if (1 < binary->op - AndInt32) {
    __assert_fail("binary->op == AndInt32 || binary->op == OrInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xd6c,
                  "Expression *wasm::OptimizeInstructions::conditionalizeExpensiveOnBitwise(Binary *)"
                 );
  }
  curr = binary->right;
  if (curr->_id == ConstId) {
    return (Expression *)(If *)0x0;
  }
  curr_00 = binary->left;
  bVar3 = Properties::emitsBoolean(curr_00);
  if (!bVar3) {
    return (Expression *)(If *)0x0;
  }
  bVar3 = Properties::emitsBoolean(curr);
  if (!bVar3) {
    return (Expression *)(If *)0x0;
  }
  effects((EffectAnalyzer *)local_328,this,curr_00);
  effects((EffectAnalyzer *)
          &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,this,curr);
  bVar3 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_328);
  bVar4 = EffectAnalyzer::hasSideEffects
                    ((EffectAnalyzer *)
                     &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (!bVar3 || !bVar4) {
    pEVar8 = curr;
    if (bVar4) {
      CostAnalyzer::CostAnalyzer((CostAnalyzer *)&local_38,curr_00);
      if ((6 < (uint)local_38.wasm) &&
         (bVar3 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)local_328,
                             (EffectAnalyzer *)
                             &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count), !bVar3)) goto LAB_00ae46e6;
    }
    else if (bVar3) {
      CostAnalyzer::CostAnalyzer((CostAnalyzer *)&local_38,curr);
      pEVar8 = curr_00;
      curr_00 = curr;
      if (6 < (uint)local_38.wasm) {
LAB_00ae46e6:
        local_38.wasm =
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
        if (binary->op == OrInt32) {
          rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
          pCVar5 = Builder::makeConst(&local_38,
                                      (Literal *)
                                      &rightEffects.delegateTargets._M_t._M_impl.
                                       super__Rb_tree_header._M_node_count);
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
          pIVar6 = Builder::makeIf(&local_38,pEVar8,(Expression *)pCVar5,curr_00,type);
          this_00 = (anon_union_16_6_1532cd5a_for_Literal_0 *)
                    &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
        }
        else {
          local_50.i32 = 0;
          local_40 = 2;
          pCVar5 = Builder::makeConst(&local_38,(Literal *)&local_50.func);
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
          pIVar6 = Builder::makeIf(&local_38,pEVar8,curr_00,(Expression *)pCVar5,type_00);
          this_00 = &local_50;
        }
        Literal::~Literal((Literal *)&this_00->func);
        goto LAB_00ae4622;
      }
    }
    else {
      CostAnalyzer::CostAnalyzer((CostAnalyzer *)&local_38,curr_00);
      uVar2 = (uint)local_38.wasm;
      CostAnalyzer::CostAnalyzer((CostAnalyzer *)&local_38,curr);
      uVar7 = (uint)local_38.wasm;
      if ((uint)local_38.wasm < uVar2) {
        uVar7 = uVar2;
      }
      if (6 < uVar7) {
        if (uVar2 <= (uint)local_38.wasm) {
          pEVar8 = curr_00;
          curr_00 = curr;
        }
        goto LAB_00ae46e6;
      }
    }
  }
  pIVar6 = (If *)0x0;
LAB_00ae4622:
  EffectAnalyzer::~EffectAnalyzer
            ((EffectAnalyzer *)
             &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_328);
  return (Expression *)pIVar6;
}

Assistant:

Expression* conditionalizeExpensiveOnBitwise(Binary* binary) {
    // this operation can increase code size, so don't always do it
    auto& options = getPassRunner()->options;
    if (options.optimizeLevel < 2 || options.shrinkLevel > 0) {
      return nullptr;
    }
    const auto MIN_COST = 7;
    assert(binary->op == AndInt32 || binary->op == OrInt32);
    if (binary->right->is<Const>()) {
      return nullptr; // trivial
    }
    // bitwise logical operator on two non-numerical values, check if they are
    // boolean
    auto* left = binary->left;
    auto* right = binary->right;
    if (!Properties::emitsBoolean(left) || !Properties::emitsBoolean(right)) {
      return nullptr;
    }
    auto leftEffects = effects(left);
    auto rightEffects = effects(right);
    auto leftHasSideEffects = leftEffects.hasSideEffects();
    auto rightHasSideEffects = rightEffects.hasSideEffects();
    if (leftHasSideEffects && rightHasSideEffects) {
      return nullptr; // both must execute
    }
    // canonicalize with side effects, if any, happening on the left
    if (rightHasSideEffects) {
      if (CostAnalyzer(left).cost < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
      if (leftEffects.invalidates(rightEffects)) {
        return nullptr; // cannot reorder
      }
      std::swap(left, right);
    } else if (leftHasSideEffects) {
      if (CostAnalyzer(right).cost < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
    } else {
      // no side effects, reorder based on cost estimation
      auto leftCost = CostAnalyzer(left).cost;
      auto rightCost = CostAnalyzer(right).cost;
      if (std::max(leftCost, rightCost) < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
      // canonicalize with expensive code on the right
      if (leftCost > rightCost) {
        std::swap(left, right);
      }
    }
    // worth it! perform conditionalization
    Builder builder(*getModule());
    if (binary->op == OrInt32) {
      return builder.makeIf(
        left, builder.makeConst(Literal(int32_t(1))), right);
    } else { // &
      return builder.makeIf(
        left, right, builder.makeConst(Literal(int32_t(0))));
    }
  }